

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_validate(REF_CAVITY ref_cavity)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  REF_NODE pRVar4;
  REF_GLOB *pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  
  iVar1 = ref_cavity->node;
  if (-1 < (long)iVar1) {
    pRVar4 = ref_cavity->ref_grid->node;
    iVar2 = pRVar4->max;
    if ((iVar1 < iVar2) && (pRVar5 = pRVar4->global, -1 < pRVar5[iVar1])) {
      uVar3 = ref_cavity->surf_node;
      if (((ulong)uVar3 == 0xffffffff) ||
         (((-1 < (int)uVar3 && ((int)uVar3 < iVar2)) && (-1 < pRVar5[uVar3])))) {
        uVar8 = 0;
        uVar6 = (ulong)(uint)ref_cavity->maxface;
        if (ref_cavity->maxface < 1) {
          uVar6 = uVar8;
        }
        uVar9 = 0;
        do {
          if (uVar9 == uVar6) {
            uVar6 = (ulong)(uint)ref_cavity->maxseg;
            if (ref_cavity->maxseg < 1) {
              uVar6 = 0;
            }
            lVar11 = 0;
            uVar8 = 0;
            do {
              if (uVar8 == uVar6) {
                return 0;
              }
              if (ref_cavity->s2n[uVar8 * 3] != -1) {
                lVar12 = 0;
                while (lVar12 != 2) {
                  uVar3 = *(uint *)((long)ref_cavity->s2n + lVar12 * 4 + lVar11);
                  if ((((long)(int)uVar3 < 0) || (iVar2 <= (int)uVar3)) ||
                     (lVar12 = lVar12 + 1, pRVar5[(int)uVar3] < 0)) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x903,"ref_cavity_validate","cavity segment node not valid");
                    printf("for node %d\n",(ulong)uVar3);
                    return 1;
                  }
                }
              }
              uVar8 = uVar8 + 1;
              lVar11 = lVar11 + 0xc;
            } while( true );
          }
          if (ref_cavity->f2n[uVar9 * 3] != -1) {
            lVar11 = 0;
            while (lVar11 != 3) {
              iVar1 = *(int *)((long)ref_cavity->f2n + lVar11 * 4 + uVar8);
              if ((((long)iVar1 < 0) || (iVar2 <= iVar1)) ||
                 (lVar11 = lVar11 + 1, pRVar5[iVar1] < 0)) {
                pcVar10 = "cavity face node not valid";
                uVar7 = 0x8fa;
                goto LAB_001523ff;
              }
            }
          }
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 + 0xc;
        } while( true );
      }
      pcVar10 = "cavity surf node not valid";
      uVar7 = 0x8f4;
      goto LAB_001523ff;
    }
  }
  pcVar10 = "cavity node not valid";
  uVar7 = 0x8f1;
LAB_001523ff:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar7,
         "ref_cavity_validate",pcVar10);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_validate(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node;
  REF_INT face, face_node;
  REF_INT seg, seg_node;

  RAS(ref_node_valid(ref_node, ref_cavity_node(ref_cavity)),
      "cavity node not valid");
  if (REF_EMPTY != ref_cavity_surf_node(ref_cavity))
    RAS(ref_node_valid(ref_node, ref_cavity_surf_node(ref_cavity)),
        "cavity surf node not valid");

  each_ref_cavity_valid_face(ref_cavity, face) {
    ; /* semi to force format */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      node = ref_cavity_f2n(ref_cavity, face_node, face);
      RAS(ref_node_valid(ref_node, node), "cavity face node not valid");
    }
  }